

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing.cc
# Opt level: O2

string * demo::Tracing::GetContext_abi_cxx11_(void)

{
  string *in_RDI;
  long in_FS_OFFSET;
  Formatter formatter;
  Formatter FStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&FStack_188);
  ReverseTrace(*(Tracing **)(in_FS_OFFSET + -0x18),&FStack_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&FStack_188);
  return in_RDI;
}

Assistant:

std::string Tracing::GetContext() {
  Formatter formatter;
  ReverseTrace(GetCurrent(), &formatter);
  return formatter.String();
}